

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationY<double>::apply
          (RotationY<double> *this,Op op,int nbQubits,
          vector<double,_std::allocator<double>_> *vector,int offset)

{
  int iVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *vector_00;
  double __x;
  double __x_00;
  double sin;
  undefined1 local_48 [8];
  anon_class_32_4_6094e784 f;
  int qubit;
  int offset_local;
  vector<double,_std::allocator<double>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  RotationY<double> *this_local;
  
  vector_00 = vector;
  f.s2._4_4_ = offset;
  iVar1 = (*(this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])();
  f.s2._0_4_ = iVar1 + f.s2._4_4_;
  __x_00 = QRotationGate1<double>::cos(&this->super_QRotationGate1<double>,__x);
  sin = QRotationGate1<double>::sin(&this->super_QRotationGate1<double>,__x_00);
  pdVar2 = std::vector<double,_std::allocator<double>_>::data(vector);
  lambda_RotationY<double,double>
            ((anon_class_32_4_6094e784 *)local_48,(qgates *)(ulong)(uint)(int)(char)op,(Op)pdVar2,
             __x_00,sin,(double *)vector_00);
  apply2<qclab::qgates::lambda_RotationY<double,double>(qclab::Op,double,double,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,f.s2._0_4_,(anon_class_32_4_6094e784 *)local_48);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }